

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanPartialInternal<duckdb::uhugeint_t,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint uVar1;
  idx_t iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pSVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  ulong uVar11;
  bool bVar12;
  uhugeint_t element;
  
  pSVar5 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  pdVar6 = BufferHandle::Ptr((BufferHandle *)(pSVar5 + 1));
  iVar2 = segment->offset;
  uVar1 = *(uint *)&pSVar5[6]._vptr_SegmentScanState;
  pdVar10 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar11 = scan_count + result_offset;
  while( true ) {
    uVar7 = uVar11 - result_offset;
    if (uVar11 < result_offset || uVar7 == 0) {
      return;
    }
    uVar8 = (ulong)*(ushort *)(pdVar6 + (long)pSVar5[4]._vptr_SegmentScanState * 2 + uVar1 + iVar2)
            - (long)pSVar5[5]._vptr_SegmentScanState;
    uVar3 = *(undefined8 *)(pdVar6 + (long)pSVar5[4]._vptr_SegmentScanState * 0x10 + iVar2 + 8);
    uVar4 = *(undefined8 *)(pdVar6 + (long)pSVar5[4]._vptr_SegmentScanState * 0x10 + iVar2 + 8 + 8);
    if (uVar7 < uVar8) break;
    pdVar9 = pdVar10 + result_offset * 0x10;
    uVar7 = uVar8;
    while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
      *(undefined8 *)pdVar9 = uVar3;
      *(undefined8 *)(pdVar9 + 8) = uVar4;
      pdVar9 = pdVar9 + 0x10;
    }
    pSVar5[4]._vptr_SegmentScanState = (_func_int **)((long)pSVar5[4]._vptr_SegmentScanState + 1);
    result_offset = result_offset + uVar8;
    pSVar5[5]._vptr_SegmentScanState = (_func_int **)0x0;
  }
  pdVar10 = pdVar10 + result_offset * 0x10;
  uVar11 = uVar7;
  while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
    *(undefined8 *)pdVar10 = uVar3;
    *(undefined8 *)(pdVar10 + 8) = uVar4;
    pdVar10 = pdVar10 + 0x10;
  }
  pSVar5[5]._vptr_SegmentScanState = (_func_int **)((long)pSVar5[5]._vptr_SegmentScanState + uVar7);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}